

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O0

int32 mllr_read_regmat(char *regmatfile,float32 ****A,float32 ***B,float32 ***H,int32 *nclass,
                      int32 ceplen)

{
  int iVar1;
  FILE *__stream;
  void *local_70;
  float32 **lH;
  float32 **lB;
  float32 ***lA;
  FILE *fp;
  int32 lnclass;
  int32 n;
  int32 k;
  int32 j;
  int32 i;
  int32 ceplen_local;
  int32 *nclass_local;
  float32 ***H_local;
  float32 ***B_local;
  float32 ****A_local;
  char *regmatfile_local;
  
  j = ceplen;
  _i = nclass;
  nclass_local = (int32 *)H;
  H_local = B;
  B_local = (float32 ***)A;
  A_local = (float32 ****)regmatfile;
  __stream = fopen(regmatfile,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
            ,0x80,"fopen(%s,r) failed\n",A_local);
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
            ,0x84,"Reading MLLR transformation file %s\n",A_local);
    lB = (float32 **)0x0;
    lH = (float32 **)0x0;
    local_70 = (void *)0x0;
    iVar1 = __isoc99_fscanf(__stream,"%d",(long)&fp + 4);
    if ((iVar1 == 1) && (0 < fp._4_4_)) {
      fp._0_4_ = fp._4_4_;
      iVar1 = __isoc99_fscanf(__stream,"%d",(long)&fp + 4);
      if ((iVar1 == 1) && (fp._4_4_ == 1)) {
        lB = (float32 **)
             __ckd_calloc_3d__((long)(int)fp,(long)j,(long)j,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                               ,0x93);
        lH = (float32 **)
             __ckd_calloc_2d__((long)(int)fp,(long)j,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                               ,0x94);
        local_70 = __ckd_calloc_2d__((long)(int)fp,(long)j,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
                                     ,0x95);
        k = 0;
        while( true ) {
          if ((int)fp <= k) {
            *B_local = lB;
            *H_local = lH;
            *(void **)nclass_local = local_70;
            if (_i != (int32 *)0x0) {
              *_i = (int)fp;
            }
            fclose(__stream);
            return 0;
          }
          iVar1 = __isoc99_fscanf(__stream,"%d",(long)&fp + 4);
          if ((iVar1 != 1) || (j != fp._4_4_)) break;
          for (n = 0; n < j; n = n + 1) {
            for (lnclass = 0; lnclass < j; lnclass = lnclass + 1) {
              iVar1 = __isoc99_fscanf(__stream,"%f ",
                                      *(long *)(lB[k] + (long)n * 2) + (long)lnclass * 4);
              if (iVar1 != 1) goto LAB_0011e4af;
            }
          }
          for (n = 0; n < j; n = n + 1) {
            iVar1 = __isoc99_fscanf(__stream,"%f ",lH[k] + n);
            if (iVar1 != 1) goto LAB_0011e4af;
          }
          for (n = 0; n < j; n = n + 1) {
            iVar1 = __isoc99_fscanf(__stream,"%f ",
                                    *(long *)((long)local_70 + (long)k * 8) + (long)n * 4);
            if (iVar1 != 1) goto LAB_0011e4af;
          }
          k = k + 1;
        }
      }
    }
LAB_0011e4af:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mllr.c"
            ,0xb7,"Error reading MLLR file %s\n",A_local);
    ckd_free_3d(lB);
    ckd_free_2d(lH);
    ckd_free_2d(local_70);
    fclose(__stream);
    *B_local = (float32 **)0x0;
    *H_local = (float32 **)0x0;
    nclass_local[0] = 0;
    nclass_local[1] = 0;
  }
  return -1;
}

Assistant:

int32
mllr_read_regmat(const char *regmatfile,
                 float32 **** A,
                 float32 *** B,
		 float32 *** H,
		 int32 * nclass, int32 ceplen)
{
    int32 i, j, k, n, lnclass;
    FILE *fp;
    float32 ***lA, **lB, **lH;

    if ((fp = fopen(regmatfile, "r")) == NULL) {
        E_ERROR("fopen(%s,r) failed\n", regmatfile);
        return -1;
    }
    else
        E_INFO("Reading MLLR transformation file %s\n", regmatfile);

    lA = NULL;
    lB = NULL;
    lH = NULL;

    if ((fscanf(fp, "%d", &n) != 1) || (n < 1))
        goto readerror;
    lnclass = n;

    /* The number of stream must be 1 for now (archan@cs.cmu.edu 24-Jul-2004) */
    if ((fscanf(fp, "%d", &n) != 1) || (n != 1))
        goto readerror;

    lA = (float32 ***) ckd_calloc_3d(lnclass, ceplen, ceplen,
                                     sizeof(float32));
    lB = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));
    lH = (float32 **) ckd_calloc_2d(lnclass, ceplen, sizeof(float32));

    for (i = 0; i < lnclass; i++) {
        /* We definitely do not allow different classes to have different
           feature vector lengths! (that would be silly) */
        if ((fscanf(fp, "%d", &n) != 1) || (ceplen != n))
            goto readerror;
        for (j = 0; j < ceplen; j++) {
            for (k = 0; k < ceplen; ++k) {
                if (fscanf(fp, "%f ", &lA[i][j][k]) != 1)
                    goto readerror;
            }
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lB[i][j]) != 1)
                goto readerror;
        }
        for (j = 0; j < ceplen; j++) {
            if (fscanf(fp, "%f ", &lH[i][j]) != 1)
                goto readerror;
        }
    }

    *A = lA;
    *B = lB;
    *H = lH;
    if (nclass)
        *nclass = lnclass;

    fclose(fp);

    return 0;

  readerror:
    E_ERROR("Error reading MLLR file %s\n", regmatfile);
    ckd_free_3d((void ***) lA);
    ckd_free_2d((void **) lB);
    ckd_free_2d((void **) lH);

    fclose(fp);

    *A = NULL;
    *B = NULL;
    *H = NULL;

    return -1;
}